

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O3

char ** hts_readlist(char *string,int is_file,int *_n)

{
  int iVar1;
  uint uVar2;
  BGZF *fp;
  kstream_t *ks;
  uchar *puVar3;
  char *pcVar4;
  char **ppcVar5;
  char *__dest;
  char *pcVar6;
  ulong uVar7;
  uint uVar8;
  int dret;
  void *local_70;
  int local_4c;
  kstring_t local_48;
  
  if (is_file == 0) {
    pcVar4 = string + 1;
    uVar8 = 0;
    local_70 = (void *)0x0;
    iVar1 = 0;
    pcVar6 = string;
    do {
      if ((pcVar4[-1] == ',') || (pcVar4[-1] == '\0')) {
        if (iVar1 <= (int)uVar8) {
          uVar2 = (int)uVar8 >> 1 | uVar8;
          uVar2 = (int)uVar2 >> 2 | uVar2;
          uVar2 = (int)uVar2 >> 4 | uVar2;
          uVar2 = (int)uVar2 >> 8 | uVar2;
          uVar2 = (int)uVar2 >> 0x10 | uVar2;
          iVar1 = uVar2 + 1;
          local_70 = realloc(local_70,(long)(int)uVar2 * 8 + 8);
        }
        uVar2 = uVar8 + 1;
        __dest = (char *)calloc(((long)pcVar6 - (long)string) + 1,1);
        *(char **)((long)local_70 + (long)(int)uVar8 * 8) = __dest;
        strncpy(__dest,string,(long)pcVar6 - (long)string);
        string = pcVar4;
        uVar8 = uVar2;
        if (pcVar4[-1] == '\0') goto LAB_0010be29;
      }
      pcVar4 = pcVar4 + 1;
      pcVar6 = pcVar6 + 1;
    } while( true );
  }
  fp = bgzf_open(string,"r");
  ppcVar5 = (char **)0x0;
  if (fp != (BGZF *)0x0) {
    ks = (kstream_t *)calloc(1,0x28);
    local_48.l = 0;
    local_48.m = 0;
    local_48.s = (char *)0x0;
    ks->f = fp;
    *(undefined4 *)&ks->field_0x8 = 0x40000;
    puVar3 = (uchar *)malloc(0x10000);
    ks->buf = puVar3;
    local_70 = (void *)0x0;
    uVar7 = 0;
    while( true ) {
      iVar1 = ks_getuntil2(ks,2,&local_48,&local_4c,0);
      uVar2 = (uint)uVar7;
      if (iVar1 < 0) break;
      if (local_48.l != 0) {
        if ((long)(int)ppcVar5 <= (long)uVar7) {
          uVar2 = (uint)(uVar7 >> 1) & 0x7fffffff | uVar2;
          uVar2 = uVar2 >> 2 | uVar2;
          uVar2 = uVar2 >> 4 | uVar2;
          uVar2 = uVar2 >> 8 | uVar2;
          uVar2 = uVar2 >> 0x10 | uVar2;
          ppcVar5 = (char **)(ulong)(uVar2 + 1);
          local_70 = realloc(local_70,(long)(int)uVar2 * 8 + 8);
        }
        pcVar4 = strdup(local_48.s);
        *(char **)((long)local_70 + uVar7 * 8) = pcVar4;
        uVar7 = uVar7 + 1;
      }
    }
    ks_destroy(ks);
    bgzf_close(fp);
    free(local_48.s);
LAB_0010be29:
    ppcVar5 = (char **)realloc(local_70,(long)(int)uVar2 * 8);
    *_n = uVar2;
  }
  return ppcVar5;
}

Assistant:

char **hts_readlist(const char *string, int is_file, int *_n)
{
    int m = 0, n = 0, dret;
    char **s = 0;
    if ( is_file )
    {
#if KS_BGZF
        BGZF *fp = bgzf_open(string, "r");
#else
        gzFile fp = gzopen(string, "r");
#endif
        if ( !fp ) return NULL;

        kstream_t *ks;
        kstring_t str;
        str.s = 0; str.l = str.m = 0;
        ks = ks_init(fp);
        while (ks_getuntil(ks, KS_SEP_LINE, &str, &dret) >= 0)
        {
            if (str.l == 0) continue;
            n++;
            hts_expand(char*,n,m,s);
            s[n-1] = strdup(str.s);
        }
        ks_destroy(ks);
#if KS_BGZF
        bgzf_close(fp);
#else
        gzclose(fp);
#endif
        free(str.s);
    }
    else
    {
        const char *q = string, *p = string;
        while ( 1 )
        {
            if (*p == ',' || *p == 0)
            {
                n++;
                hts_expand(char*,n,m,s);
                s[n-1] = (char*)calloc(p - q + 1, 1);
                strncpy(s[n-1], q, p - q);
                q = p + 1;
            }
            if ( !*p ) break;
            p++;
        }
    }
    s = (char**)realloc(s, n * sizeof(char*));
    *_n = n;
    return s;
}